

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O2

int bget_get_bin(bufsize size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0x13;
  iVar2 = 0;
  while (iVar1 = iVar2, 1 < iVar3 - iVar1) {
    iVar2 = iVar1 + iVar3 >> 1;
    if (size < bget_bin_size[iVar2]) {
      iVar3 = iVar2 + -1;
      iVar2 = iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int bget_get_bin(bufsize size) {
  // binary chop bins
  int lo = 0, hi = MAX_BGET_BINS - 1;

  KMP_DEBUG_ASSERT(size > 0);

  while ((hi - lo) > 1) {
    int mid = (lo + hi) >> 1;
    if (size < bget_bin_size[mid])
      hi = mid - 1;
    else
      lo = mid;
  }

  KMP_DEBUG_ASSERT((lo >= 0) && (lo < MAX_BGET_BINS));

  return lo;
}